

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

void __thiscall
LiteScript::_Type_ARRAY::Save
          (_Type_ARRAY *this,ostream *stream,Object *object,offset_in_Memory_to_subr caller)

{
  Array *pAVar1;
  uint uVar2;
  Object *pOVar3;
  char *__s;
  size_t sVar4;
  uint uVar5;
  pointer in_R8;
  long *plVar6;
  pointer ppVar7;
  char local_60 [16];
  pointer local_50;
  Array *local_48;
  Object *local_40;
  pointer local_38;
  
  pAVar1 = (Array *)object->data;
  local_50 = (pointer)caller;
  local_40 = object;
  local_38 = in_R8;
  uVar2 = Array::UnamedCount(pAVar1);
  local_60[0] = (char)uVar2;
  std::__ostream_insert<char,std::char_traits<char>>(stream,local_60,1);
  local_60[0] = (char)(uVar2 >> 8);
  std::__ostream_insert<char,std::char_traits<char>>(stream,local_60,1);
  local_60[0] = (char)(uVar2 >> 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(stream,local_60,1);
  local_60[0] = (char)(uVar2 >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(stream,local_60,1);
  local_48 = pAVar1;
  uVar2 = Array::UnamedCount(pAVar1);
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      plVar6 = (long *)((long)&local_38->obj + (long)&local_40->memory->arr);
      ppVar7 = local_50;
      if (((ulong)local_50 & 1) != 0) {
        ppVar7 = *(pointer *)(*plVar6 + -1 + (long)local_50);
      }
      Array::ConstantGet((Array *)local_60,(uint)local_48);
      pOVar3 = Variable::operator->((Variable *)local_60);
      (*(code *)ppVar7)(plVar6,stream,pOVar3->ID);
      Variable::~Variable((Variable *)local_60);
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  pAVar1 = local_48;
  uVar2 = Array::UnamedCount(local_48);
  local_60[0] = (char)uVar2;
  std::__ostream_insert<char,std::char_traits<char>>(stream,local_60,1);
  local_60[0] = (char)(uVar2 >> 8);
  std::__ostream_insert<char,std::char_traits<char>>(stream,local_60,1);
  local_60[0] = (char)(uVar2 >> 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(stream,local_60,1);
  local_60[0] = (char)(uVar2 >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(stream,local_60,1);
  uVar2 = Array::NamedCount(pAVar1);
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      __s = Array::GetNamedKey(local_48,uVar5);
      if (__s == (char *)0x0) {
        std::ios::clear((int)stream + (int)*(undefined8 *)(*(long *)stream + -0x18));
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(stream,__s,sVar4);
      }
      local_60[0] = '\0';
      std::__ostream_insert<char,std::char_traits<char>>(stream,local_60,1);
      plVar6 = (long *)((long)&local_38->obj + (long)&local_40->memory->arr);
      ppVar7 = local_50;
      if (((ulong)local_50 & 1) != 0) {
        ppVar7 = *(pointer *)(*plVar6 + -1 + (long)local_50);
      }
      Array::GetNamedVariable((Array *)local_60,(uint)local_48);
      pOVar3 = Variable::operator->((Variable *)local_60);
      (*(code *)ppVar7)(plVar6,stream,pOVar3->ID);
      Variable::~Variable((Variable *)local_60);
      uVar5 = uVar5 + 1;
    } while (uVar2 != uVar5);
  }
  return;
}

Assistant:

void LiteScript::_Type_ARRAY::Save(std::ostream &stream, Object &object, bool (Memory::*caller)(std::ostream&, unsigned int)) const {
    Array& obj = object.GetData<Array>();
    OStreamer::Write<unsigned int>(stream, obj.UnamedCount());
    for (unsigned int i = 0, sz = obj.UnamedCount(); i < sz; i++)
        (object.memory.*caller)(stream, obj.ConstantGet(i)->ID);
    OStreamer::Write<unsigned int>(stream, obj.UnamedCount());
    for (unsigned int i = 0, sz = obj.NamedCount(); i < sz; i++) {
        stream << obj.GetNamedKey(i) << (uint8_t)0;
        (object.memory.*caller)(stream, obj.GetNamedVariable(i)->ID);
    }
}